

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_private.c
# Opt level: O0

char * zt_log_gen_fmt(zt_log_ty *log,char *fmt,char *file,int line,char *function,zt_log_level level
                     ,uint opts)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  tm *__tp;
  char *pcVar4;
  uint in_ECX;
  char *in_RDX;
  char *in_RSI;
  char *in_R8;
  uint in_R9D;
  uint in_stack_00000008;
  size_t nlen;
  char *nbuff;
  pid_t pid;
  char sbuf_2 [13];
  char *t;
  char sbuf_1 [255];
  time_t tt;
  char sbuf [255];
  char *buff;
  size_t len;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  int opts_00;
  long lVar5;
  char *in_stack_fffffffffffffd80;
  char local_26d [13];
  char *local_260;
  char local_258 [264];
  time_t local_150;
  char local_148 [264];
  char *local_40;
  long local_38;
  uint local_2c;
  char *local_28;
  uint local_1c;
  char *local_18;
  char *local_10;
  
  opts_00 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  local_38 = 0;
  local_40 = (char *)0x0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = strlen(in_RSI);
  local_38 = sVar3 + 4;
  local_40 = (char *)zt_calloc_p((size_t)in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68
                                );
  if ((in_stack_00000008 & 1) != 0) {
    local_150 = time((time_t *)0x0);
    in_stack_fffffffffffffd70 = local_148;
    __tp = localtime(&local_150);
    sVar3 = strftime(in_stack_fffffffffffffd70,0xfe,"%b %d %H:%M:%S ",__tp);
    local_38 = sVar3 + local_38;
    local_40 = (char *)zt_realloc_p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    sprintf(local_40,"%s",local_148);
  }
  if ((in_stack_00000008 & 4) != 0) {
    local_260 = (char *)0x0;
    iVar1 = gethostname(local_258,0xfe);
    if (iVar1 == -1) {
      sprintf(local_258,"*hostname*");
    }
    local_260 = strchr(local_258,0x2e);
    if (local_260 != (char *)0x0) {
      *local_260 = '\0';
    }
    sVar3 = strlen(local_258);
    local_38 = sVar3 + 1 + local_38;
    local_40 = (char *)zt_realloc_p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    strcat(local_40,local_258);
    if (4 < in_stack_00000008) {
      strcat(local_40," ");
    }
  }
  if ((in_stack_00000008 & 8) != 0) {
    pcVar4 = zt_progname(in_stack_fffffffffffffd80,opts_00);
    sVar3 = strlen(pcVar4);
    local_38 = sVar3 + local_38;
    in_stack_fffffffffffffd68 =
         (char *)zt_realloc_p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    local_40 = in_stack_fffffffffffffd68;
    pcVar4 = zt_progname(in_stack_fffffffffffffd80,opts_00);
    strcat(in_stack_fffffffffffffd68,pcVar4);
  }
  if ((in_stack_00000008 & 0x10) != 0) {
    uVar2 = getpid();
    sprintf(local_26d,"[%u]",(ulong)uVar2);
    sVar3 = strlen(local_26d);
    local_38 = sVar3 + local_38;
    local_40 = (char *)zt_realloc_p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    strcat(local_40,local_26d);
  }
  if ((((in_stack_00000008 & 2) != 0) && (local_2c < 8)) && (-1 < (int)local_2c)) {
    sVar3 = strlen(zt_log_level_desc[local_2c].desc);
    local_38 = sVar3 + 2 + local_38;
    local_40 = (char *)zt_realloc_p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    if (in_stack_00000008 != 2) {
      strcat(local_40,": ");
    }
    strcat(local_40,zt_log_level_desc[local_2c].desc);
  }
  if (in_stack_00000008 != 0) {
    strcat(local_40,": ");
  }
  strcat(local_40,local_10);
  if (((local_18 != (char *)0x0) && (-1 < (int)local_1c)) && (local_28 != (char *)0x0)) {
    lVar5 = 0xd;
    sVar3 = strlen(local_18);
    lVar5 = sVar3 + lVar5;
    sVar3 = strlen(local_28);
    lVar5 = sVar3 + lVar5 + 10;
    pcVar4 = (char *)zt_calloc_p((size_t)in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68
                                );
    sprintf(pcVar4,": in %s at (%s:%d)",local_28,local_18,(ulong)local_1c);
    local_38 = lVar5 + local_38;
    local_40 = (char *)zt_realloc_p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    strcat(local_40,pcVar4);
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
  }
  strcat(local_40,"\n");
  return local_40;
}

Assistant:

char*
zt_log_gen_fmt(zt_log_ty * log, const char * fmt, const char * file, int line, const char * function, zt_log_level level, unsigned int opts) {
    size_t len  = 0;
    char * buff = NULL;

    len  = strlen(fmt) + 4;   /* format + seperator + "\n" + null */
    buff = (char*)zt_calloc(char, len);  /* mem_calloc(len, sizeof(char)); */

    if (opts & ZT_LOG_WITH_DATE) {
        char   sbuf[255];
        time_t tt = time(NULL);

        len += strftime(sbuf, 254, "%b %d %H:%M:%S ", localtime(&tt));

        buff = zt_realloc(char, buff, len);
        sprintf(buff, "%s", sbuf);
    }

    if (opts & ZT_LOG_WITH_SYSNAME) {
        char   sbuf[255];
        char * t = NULL;

        if (gethostname(sbuf, 254) == -1) {
            sprintf(sbuf, "*hostname*");
        }
        t    = strchr(sbuf, '.');
        if (t) {
            *t = '\0';
        }
        len += strlen(sbuf) + 1;    /* sbuf + space */
        buff = zt_realloc(char, buff, len);
        strcat(buff, sbuf);
        if ((opts > ZT_LOG_WITH_SYSNAME)) {
            strcat(buff, " ");
        }
    }

    if (opts & ZT_LOG_WITH_PROGNAME) {
        len += strlen(zt_progname(NULL, 0)); /* progname */
        buff = zt_realloc(char, buff, len);
        strcat(buff, zt_progname(NULL, 0));
    }

    if (opts & ZT_LOG_WITH_PID) {
        char  sbuf[10 + 3];       /* pid + [] + null */
        pid_t pid = getpid();

        sprintf(sbuf, "[%u]", pid);
        len += strlen(sbuf);
        buff = zt_realloc(char, buff, len);
        strcat(buff, sbuf);
    }

    if (opts & ZT_LOG_WITH_LEVEL) {
        if ((level < zt_log_max) && ((int)level >= zt_log_emerg)) {
            len += strlen(zt_log_level_desc[level].desc) + 2; /* ': ' + level desc */
            buff = zt_realloc(char, buff, len);
            if (opts != ZT_LOG_WITH_LEVEL) {
                strcat(buff, ": ");
            }
            strcat(buff, zt_log_level_desc[level].desc);
        }
    }
    if (opts != ZT_LOG_RAW) {
        strcat(buff, ": ");
    }
    strcat(buff, fmt);
    if (((file) && (line > -1) && (function))) {
        char * nbuff = NULL;
        size_t nlen  = 13;    /* ': in  at (:)' + null */

        nlen += strlen(file);
        nlen += strlen(function);
        nlen += 10;    /* length of a int to str */
        nbuff = zt_calloc(char, nlen); /* mem_calloc(nlen, sizeof(char)); */
        sprintf(nbuff, ": in %s at (%s:%d)", function, file, line);
        len  += nlen;
        buff  = zt_realloc(char, buff, len);
        strcat(buff, nbuff);
        zt_free(nbuff);
    }
    strcat(buff, "\n");
    return buff;
}